

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

FFSFormatList AddUniqueFormats(FFSFormatList List,FFSFormatList Candidates,int copy)

{
  FFSFormatBlock *pFVar1;
  int iVar2;
  char *pcVar3;
  int in_EDX;
  FFSFormatBlock *in_RSI;
  FFSFormatList in_RDI;
  FFSFormatList Tmp_1;
  FFSFormatList ThisCandidate;
  int Found;
  FFSFormatList Tmp;
  FFSFormatList Last;
  FFSFormatBlock *local_38;
  int local_2c;
  FFSFormatList local_28;
  FFSFormatList local_20;
  FFSFormatBlock *local_10;
  FFSFormatList local_8;
  
  pFVar1 = in_RSI;
  local_8 = in_RDI;
  while (local_10 = pFVar1, local_10 != (FFSFormatBlock *)0x0) {
    local_20 = (FFSFormatList)0x0;
    local_2c = 0;
    local_38 = local_10;
    for (local_28 = local_8; local_28 != (FFSFormatList)0x0; local_28 = local_28->Next) {
      if ((local_28->FormatIDRepLen == local_10->FormatIDRepLen) &&
         (iVar2 = memcmp(local_28->FormatIDRep,local_10->FormatIDRep,local_28->FormatIDRepLen),
         iVar2 == 0)) {
        local_2c = local_2c + 1;
      }
      local_20 = local_28;
    }
    pFVar1 = local_10->Next;
    if (local_2c == 0) {
      if (in_EDX == 0) {
        local_10->Next = (FFSFormatBlock *)0x0;
      }
      else {
        local_38 = (FFSFormatBlock *)malloc(0x28);
        memset(local_38,0,0x28);
        pcVar3 = (char *)malloc(local_10->FormatServerRepLen);
        local_38->FormatServerRep = pcVar3;
        memcpy(local_38->FormatServerRep,local_10->FormatServerRep,local_10->FormatServerRepLen);
        local_38->FormatServerRepLen = local_10->FormatServerRepLen;
        pcVar3 = (char *)malloc(local_10->FormatIDRepLen);
        local_38->FormatIDRep = pcVar3;
        memcpy(local_38->FormatIDRep,local_10->FormatIDRep,local_10->FormatIDRepLen);
        local_38->FormatIDRepLen = local_10->FormatIDRepLen;
      }
      if (local_20 == (FFSFormatList)0x0) {
        local_8 = local_38;
      }
      else {
        local_20->Next = local_38;
      }
    }
  }
  return local_8;
}

Assistant:

static FFSFormatList AddUniqueFormats(FFSFormatList List, FFSFormatList Candidates, int copy)
{
    while (Candidates)
    {
        FFSFormatList Last = NULL;
        FFSFormatList Tmp = List;
        int Found = 0;
        FFSFormatList ThisCandidate = Candidates;
        while (Tmp)
        {
            if ((Tmp->FormatIDRepLen == ThisCandidate->FormatIDRepLen) &&
                (memcmp(Tmp->FormatIDRep, ThisCandidate->FormatIDRep, Tmp->FormatIDRepLen) == 0))
            {
                // Identical format already in List, don't add this one
                Found++;
            }
            Last = Tmp;
            Tmp = Tmp->Next;
        }
        Candidates = Candidates->Next;
        if (!Found)
        {
            // New format not in list, add him to tail.
            if (copy)
            {
                // Copy top Candidates entry before return
                FFSFormatList Tmp = malloc(sizeof(*Tmp));
                memset(Tmp, 0, sizeof(*Tmp));
                Tmp->FormatServerRep = malloc(ThisCandidate->FormatServerRepLen);
                memcpy(Tmp->FormatServerRep, ThisCandidate->FormatServerRep,
                       ThisCandidate->FormatServerRepLen);
                Tmp->FormatServerRepLen = ThisCandidate->FormatServerRepLen;
                Tmp->FormatIDRep = malloc(ThisCandidate->FormatIDRepLen);
                memcpy(Tmp->FormatIDRep, ThisCandidate->FormatIDRep, ThisCandidate->FormatIDRepLen);
                Tmp->FormatIDRepLen = ThisCandidate->FormatIDRepLen;
                ThisCandidate = Tmp;
            }
            else
            {
                // disconnect this guy so that he can become list end
                ThisCandidate->Next = NULL;
            }
            if (Last)
            {
                Last->Next = ThisCandidate;
            }
            else
            {
                List = ThisCandidate;
            }
        }
    }
    return List;
}